

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullStore.cpp
# Opt level: O2

MessageStore * __thiscall FIX::NullStoreFactory::create(NullStoreFactory *this,SessionID *param_1)

{
  NullStore *this_00;
  
  this_00 = (NullStore *)operator_new(0x28);
  NullStore::NullStore(this_00);
  return &this_00->super_MessageStore;
}

Assistant:

MessageStore* NullStoreFactory::create( const SessionID& )
{
  return new NullStore();
}